

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

uint32_t __thiscall ImgfsFile::allocchunk(ImgfsFile *this,uint size,chunktype_t tag)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 *puVar3;
  size_type sVar4;
  difference_type dVar5;
  uint64_t ofs;
  int local_104;
  anon_class_8_1_ba1d7991 aStack_100;
  uint ix;
  string *local_e8;
  undefined8 local_e0;
  chunktype_t *local_d8;
  string local_d0 [8];
  string str;
  iterator end;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  local_a0;
  chunktype_t *local_98;
  value_type local_89;
  size_type local_88;
  size_t oldsize;
  pointer local_78;
  size_t nfreeatend;
  undefined1 local_68 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>_>
  local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>_>
  last;
  chunktype_t local_41;
  chunktype_t *local_40;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  local_38;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  local_30;
  iterator i;
  uint n;
  chunktype_t tag_local;
  uint size_local;
  ImgfsFile *this_local;
  
  if (size == 0) {
    this_local._4_4_ = 0;
  }
  else {
    if (size % (this->_hdr).bytesperchunk != 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "allocchunk: unaligned size";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    i._M_current._4_4_ = size / (this->_hdr).bytesperchunk;
    local_38._M_current =
         (chunktype_t *)
         std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::begin
                   (&this->_chunkmap);
    local_40 = (chunktype_t *)
               std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::end
                         (&this->_chunkmap);
    local_41 = FREECHUNK;
    local_30 = std::
               search_n<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,unsigned_int,ImgfsFile::chunktype_t>
                         (local_38,(__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                                    )local_40,i._M_current._4_4_,&local_41);
    last.current._M_current =
         std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::end
                   (&this->_chunkmap);
    bVar1 = __gnu_cxx::operator==(&local_30,&last.current);
    if (bVar1) {
      std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::rbegin
                ((vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_> *)
                 (local_68 + 8));
      std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::rend
                ((vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_> *)local_68
                );
      std::
      find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>>,ImgfsFile::allocchunk(unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_1_>
                (&local_58,local_68 + 8,local_68);
      std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::rbegin
                ((vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_> *)&oldsize
                );
      local_78 = (pointer)std::operator-(&local_58,
                                         (reverse_iterator<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>_>
                                          *)&oldsize);
      local_88 = std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::size
                           (&this->_chunkmap);
      sVar4 = std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::size
                        (&this->_chunkmap);
      uVar2 = roundsize(((int)sVar4 + i._M_current._4_4_) - (int)local_78,
                        (this->_hdr).chunksperblock);
      local_89 = FREECHUNK;
      std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::resize
                (&this->_chunkmap,(ulong)uVar2,&local_89);
      end = std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::begin
                      (&this->_chunkmap);
      local_a0 = __gnu_cxx::
                 __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                 ::operator+(&end,local_88);
      local_98 = (chunktype_t *)
                 __gnu_cxx::
                 __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                 ::operator-(&local_a0,(difference_type)local_78);
      local_30 = (__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                  )local_98;
    }
    str.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
         ::operator+(&local_30,(ulong)i._M_current._4_4_);
    std::__cxx11::string::string(local_d0);
    local_d8 = local_30._M_current;
    local_e0 = str.field_2._8_8_;
    local_e8 = (string *)local_d0;
    aStack_100 = std::
                 for_each<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,ImgfsFile::allocchunk(unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_2_>
                           (local_30,(__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                                      )str.field_2._8_8_,(string *)local_d0);
    ofs = (uint64_t)
          std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::begin
                    (&this->_chunkmap);
    dVar5 = __gnu_cxx::operator-
                      (&local_30,
                       (__normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                        *)&ofs);
    local_104 = (int)dVar5;
    this_local._4_4_ = local_104 * (this->_hdr).bytesperchunk;
    markchunk(this,(ulong)this_local._4_4_,size,tag);
    std::__cxx11::string::~string(local_d0);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t allocchunk(unsigned size, chunktype_t tag)
    {
        if (size==0) return 0;
        if (size%_hdr.bytesperchunk)
            throw "allocchunk: unaligned size";

        unsigned n= size/_hdr.bytesperchunk;
        chunkmap_t::iterator i= std::search_n(_chunkmap.begin(), _chunkmap.end(), n, FREECHUNK);
        if (i==_chunkmap.end()) {
            // alloc more space from outer layer ( fffbfffd reader )
            auto last= std::find_if(_chunkmap.rbegin(), _chunkmap.rend(), [](chunktype_t t){ return t!=ImgfsFile::FREECHUNK; });
            size_t nfreeatend= last-_chunkmap.rbegin();
            size_t oldsize= _chunkmap.size();

            _chunkmap.resize(roundsize(_chunkmap.size()+n-nfreeatend, _hdr.chunksperblock), FREECHUNK);

//            printf("added %d chunks\n", (int)(_chunkmap.size()-oldsize));

            i= _chunkmap.begin()+oldsize-nfreeatend;
        }

        chunkmap_t::iterator end= i+n;
        std::string str;
        std::for_each(i, end, [&str](chunktype_t t){ str += (char)t; });

        unsigned ix= i-_chunkmap.begin();
        uint64_t ofs= ix*_hdr.bytesperchunk;
        //printf("allocchunk(%08x) ->: %06x:%06x:%08llx '%s'\n", size, int(i-_chunkmap.begin()), ix, ofs, str.c_str());
        markchunk(ofs, size, tag);
        if (ofs>>32)
            throw "allocchunk: offset too large";
        return (uint32_t)ofs;
    }